

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O0

void __thiscall
wallet::coinselector_tests::SelectCoins_effective_value_test::test_method
          (SelectCoins_effective_value_test *this)

{
  long lVar1;
  CFeeRate discard_feerate;
  CFeeRate long_term_feerate;
  initializer_list<COutPoint> __l;
  bool bVar2;
  CoinsResult *this_00;
  allocator_type *__a;
  pointer pCVar3;
  PreSelectedInputs *in_RDI;
  long in_FS_OFFSET;
  CAmount target;
  unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> dummyWallet;
  unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> wallet;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock24;
  CoinSelectionParams cs_params;
  Result<wallet::SelectionResult> result;
  T preset_inputs;
  COutput output;
  CCoinControl cc;
  FastRandomContext rand;
  CoinsResult available_coins;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8a8;
  CFeeRate *this_01;
  allocator<COutPoint> *this_02;
  CCoinControl *this_03;
  CoinsResult *in_stack_fffffffffffff8b0;
  undefined1 fDeterministic;
  undefined4 in_stack_fffffffffffff8b8;
  undefined4 uVar4;
  int in_stack_fffffffffffff8bc;
  undefined4 uVar5;
  uint in_stack_fffffffffffff8c4;
  undefined7 in_stack_fffffffffffff8d0;
  undefined1 in_stack_fffffffffffff8d7;
  undefined4 in_stack_fffffffffffff8d8;
  int in_stack_fffffffffffff8dc;
  CFeeRate in_stack_fffffffffffff8e0;
  _Optional_payload_base<int> in_stack_fffffffffffff8e8;
  unit_test_log_t *this_04;
  char *in_stack_fffffffffffff8f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8f8;
  CCoinControl *in_stack_fffffffffffff900;
  CoinsResult *in_stack_fffffffffffff910;
  NodeContext *in_stack_fffffffffffff918;
  int in_stack_fffffffffffff920;
  CCoinControl *coin_control;
  allocator<char> *nTargetValue;
  CoinsResult *available_coins_00;
  CWallet *wallet_00;
  undefined1 in_stack_fffffffffffff992;
  undefined1 in_stack_fffffffffffff993;
  int in_stack_fffffffffffff994;
  CAmount *in_stack_fffffffffffff998;
  CWallet *in_stack_fffffffffffff9a0;
  CoinsResult *in_stack_fffffffffffff9a8;
  shared_count in_stack_fffffffffffff9e0;
  CCoinControl *in_stack_fffffffffffff9e8;
  CWallet *in_stack_fffffffffffff9f0;
  allocator<COutPoint> local_5f2 [22];
  undefined4 local_5dc;
  COutput *local_5d8;
  CFeeRate in_stack_fffffffffffffa30;
  COutput *local_570;
  PreselectedInput *local_568;
  allocator<char> local_539 [16];
  allocator<char> local_529 [25];
  _Optional_payload_base<int> local_510 [27];
  uchar local_438 [8];
  uchar auStack_430 [24];
  uint32_t local_418;
  int in_stack_fffffffffffffc20;
  int in_stack_fffffffffffffc30;
  undefined4 in_stack_fffffffffffffc34;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  available_coins_00 =
       (CoinsResult *)&(in_RDI->coins)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  wallet_00 = (CWallet *)local_529;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0,
             (allocator<char> *)in_stack_fffffffffffff8e8);
  NewWallet(in_stack_fffffffffffff918,(string *)in_stack_fffffffffffff910);
  std::__cxx11::string::~string(in_stack_fffffffffffff8a8);
  std::allocator<char>::~allocator(local_529);
  CoinsResult::CoinsResult(in_stack_fffffffffffff8b0);
  fDeterministic = (undefined1)((ulong)in_stack_fffffffffffff8b0 >> 0x38);
  coin_control = (CCoinControl *)
                 &(in_RDI->coins)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  nTargetValue = local_539;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0,
             (allocator<char> *)in_stack_fffffffffffff8e8);
  NewWallet(in_stack_fffffffffffff918,(string *)in_stack_fffffffffffff910);
  std::__cxx11::string::~string(in_stack_fffffffffffff8a8);
  std::allocator<char>::~allocator(local_539);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
            ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
  CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_fffffffffffff8a8,0);
  uVar4 = 0;
  this_01 = (CFeeRate *)((ulong)in_stack_fffffffffffff8a8 & 0xffffffff00000000);
  add_coin(in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,in_stack_fffffffffffff998,
           in_stack_fffffffffffffa30,in_stack_fffffffffffff994,(bool)in_stack_fffffffffffff993,
           in_stack_fffffffffffffc20,(bool)in_stack_fffffffffffff992,in_stack_fffffffffffffc30);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::~unique_ptr
            ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             CONCAT44(in_stack_fffffffffffff8bc,uVar4));
  FastRandomContext::FastRandomContext
            ((FastRandomContext *)CONCAT44(in_stack_fffffffffffff8bc,uVar4),(bool)fDeterministic);
  CFeeRate::CFeeRate<int>(this_01,0);
  CFeeRate::CFeeRate<int>(this_01,0);
  CFeeRate::CFeeRate<int>(this_01,0);
  std::optional<int>::optional((optional<int> *)local_510);
  uVar5 = 0;
  uVar4 = 0;
  long_term_feerate.nSatoshisPerK._4_4_ = in_stack_fffffffffffff8dc;
  long_term_feerate.nSatoshisPerK._0_4_ = in_stack_fffffffffffff8d8;
  discard_feerate.nSatoshisPerK._7_1_ = in_stack_fffffffffffff8d7;
  discard_feerate.nSatoshisPerK._0_7_ = in_stack_fffffffffffff8d0;
  CoinSelectionParams::CoinSelectionParams
            ((CoinSelectionParams *)local_510[0],
             (FastRandomContext *)((ulong)in_stack_fffffffffffff8c4 << 0x20),
             in_stack_fffffffffffff8bc,0,(CAmount)local_570,in_stack_fffffffffffff8e0,
             long_term_feerate,discard_feerate,in_stack_fffffffffffff920,
             SUB81((ulong)local_568 >> 0x38,0),(optional<int>)in_stack_fffffffffffff8e8);
  CCoinControl::CCoinControl(in_stack_fffffffffffff900);
  CoinsResult::All(in_stack_fffffffffffff910);
  std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::at
            ((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)
             CONCAT44(in_stack_fffffffffffff8bc,uVar4),(size_type)local_570);
  COutput::COutput((COutput *)CONCAT44(in_stack_fffffffffffff8bc,uVar4),local_570);
  std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::~vector
            ((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)
             CONCAT44(in_stack_fffffffffffff8bc,uVar4));
  CCoinControl::SetInputWeight
            ((CCoinControl *)CONCAT44(in_stack_fffffffffffff8bc,uVar4),(COutPoint *)local_570,
             (int64_t)local_568);
  CCoinControl::Select
            ((CCoinControl *)local_510[0],(COutPoint *)CONCAT44(in_stack_fffffffffffff8c4,uVar5));
  PreselectedInput::SetTxOut(local_568,(CTxOut *)0xd75d65);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator->
            ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)local_568);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)local_568);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff8e8,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff8e0.nSatoshisPerK,
             (char *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),
             (char *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0),
             local_510[0]._4_4_,local_510[0]._M_payload._3_1_);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
            ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             CONCAT44(in_stack_fffffffffffff8bc,uVar4));
  FetchSelectedInputs(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,
                      (CoinSelectionParams *)in_stack_fffffffffffff9e0.pi_);
  inline_assertion_check<true,util::Result<wallet::PreSelectedInputs>>
            ((Result<wallet::PreSelectedInputs> *)in_stack_fffffffffffff8e8,
             (char *)in_stack_fffffffffffff8e0.nSatoshisPerK,in_stack_fffffffffffff8dc,
             (char *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0),
             (char *)local_510[0]);
  this_00 = (CoinsResult *)
            util::Result<wallet::PreSelectedInputs>::operator*
                      ((Result<wallet::PreSelectedInputs> *)local_568);
  PreSelectedInputs::PreSelectedInputs
            ((PreSelectedInputs *)CONCAT44(in_stack_fffffffffffff8bc,uVar4),
             (PreSelectedInputs *)local_570);
  util::Result<wallet::PreSelectedInputs>::~Result((Result<wallet::PreSelectedInputs> *)local_568);
  local_5dc = 2;
  __a = (allocator_type *)
        std::
        map<OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
        ::operator[]((map<OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
                      *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0),
                     (key_type *)local_510[0]);
  local_5d8 = (COutput *)
              std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::begin
                        ((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)local_570);
  pCVar3 = __gnu_cxx::
           __normal_iterator<wallet::COutput_*,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>
           ::operator->((__normal_iterator<wallet::COutput_*,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>
                         *)local_568);
  local_418 = (pCVar3->outpoint).n;
  local_438 = *(uchar (*) [8])
               (pCVar3->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems;
  auStack_430._0_8_ =
       *(undefined8 *)((pCVar3->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  auStack_430._8_8_ =
       *(undefined8 *)
        ((pCVar3->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  auStack_430._16_8_ =
       *(undefined8 *)
        ((pCVar3->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  SaltedOutpointHasher::SaltedOutpointHasher
            ((SaltedOutpointHasher *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),
             (bool)in_stack_fffffffffffff8d7);
  this_02 = local_5f2;
  std::allocator<COutPoint>::allocator((allocator<COutPoint> *)local_568);
  __l._M_len._0_4_ = in_stack_fffffffffffff8e8._M_payload;
  __l._M_len._4_1_ = in_stack_fffffffffffff8e8._M_engaged;
  __l._M_len._5_3_ = in_stack_fffffffffffff8e8._5_3_;
  __l._M_array = (iterator)in_stack_fffffffffffff8e0.nSatoshisPerK;
  std::
  unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
  ::unordered_set((unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
                   *)local_510[0],__l,CONCAT44(in_stack_fffffffffffff8c4,uVar5),
                  (hasher *)CONCAT44(in_stack_fffffffffffff8bc,uVar4),(key_equal *)local_570,__a);
  CoinsResult::Erase(this_00,(unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
                              *)__a);
  std::
  unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
  ::~unordered_set((unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
                    *)this_02);
  std::allocator<COutPoint>::~allocator(this_02);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
            ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             CONCAT44(in_stack_fffffffffffff8bc,uVar4));
  this_03 = (CCoinControl *)(local_510 + 1);
  SelectCoins(wallet_00,available_coins_00,in_RDI,(CAmount *)nTargetValue,coin_control,
              (CoinSelectionParams *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
  do {
    this_04 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)CONCAT44(in_stack_fffffffffffff8bc,uVar4),
               (pointer)local_570,(unsigned_long)this_03);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_03)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_04,(const_string *)in_stack_fffffffffffff8e0.nSatoshisPerK,
               CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),
               (const_string *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0));
    util::Result::operator_cast_to_bool((Result<wallet::SelectionResult> *)this_03);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_fffffffffffff8bc,uVar4),
               SUB81((ulong)local_570 >> 0x38,0));
    in_stack_fffffffffffff8e0.nSatoshisPerK = (CAmount)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)CONCAT44(in_stack_fffffffffffff8bc,uVar4),
               (pointer)local_570,(unsigned_long)this_03);
    boost::unit_test::operator<<((lazy_ostream *)local_570,(basic_cstring<const_char> *)this_03);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)CONCAT44(in_stack_fffffffffffff8bc,uVar4),
               (pointer)local_570,(unsigned_long)this_03);
    this_03 = (CCoinControl *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&stack0xfffffffffffff9d0,(lazy_ostream *)&stack0xfffffffffffff9b0
               ,(const_string *)&stack0xfffffffffffff990,0x610,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_03);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_03);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
    in_stack_fffffffffffff8dc = CONCAT13(bVar2,(int3)in_stack_fffffffffffff8dc);
  } while (bVar2);
  util::Result<wallet::SelectionResult>::~Result((Result<wallet::SelectionResult> *)this_03);
  PreSelectedInputs::~PreSelectedInputs((PreSelectedInputs *)this_03);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)this_03);
  COutput::~COutput((COutput *)this_03);
  CCoinControl::~CCoinControl(this_03);
  FastRandomContext::~FastRandomContext((FastRandomContext *)this_03);
  CoinsResult::~CoinsResult((CoinsResult *)this_03);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::~unique_ptr
            ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             CONCAT44(in_stack_fffffffffffff8bc,uVar4));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(SelectCoins_effective_value_test)
{
    // Test that the effective value is used to check whether preset inputs provide sufficient funds when subtract_fee_outputs is not used.
    // This test creates a coin whose value is higher than the target but whose effective value is lower than the target.
    // The coin is selected using coin control, with m_allow_other_inputs = false. SelectCoins should fail due to insufficient funds.

    std::unique_ptr<CWallet> wallet = NewWallet(m_node);

    CoinsResult available_coins;
    {
        std::unique_ptr<CWallet> dummyWallet = NewWallet(m_node, /*wallet_name=*/"dummy");
        add_coin(available_coins, *dummyWallet, 100000); // 0.001 BTC
    }

    CAmount target{99900}; // 0.000999 BTC

    FastRandomContext rand;
    CoinSelectionParams cs_params{
        rand,
        /*change_output_size=*/34,
        /*change_spend_size=*/148,
        /*min_change_target=*/1000,
        /*effective_feerate=*/CFeeRate(3000),
        /*long_term_feerate=*/CFeeRate(1000),
        /*discard_feerate=*/CFeeRate(1000),
        /*tx_noinputs_size=*/0,
        /*avoid_partial=*/false,
    };
    CCoinControl cc;
    cc.m_allow_other_inputs = false;
    COutput output = available_coins.All().at(0);
    cc.SetInputWeight(output.outpoint, 148);
    cc.Select(output.outpoint).SetTxOut(output.txout);

    LOCK(wallet->cs_wallet);
    const auto preset_inputs = *Assert(FetchSelectedInputs(*wallet, cc, cs_params));
    available_coins.Erase({available_coins.coins[OutputType::BECH32].begin()->outpoint});

    const auto result = SelectCoins(*wallet, available_coins, preset_inputs, target, cc, cs_params);
    BOOST_CHECK(!result);
}